

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall wasm::WasmValidator::validate(WasmValidator *this,Module *module,Flags flags)

{
  bool bVar1;
  int iVar2;
  pointer func_00;
  string local_440 [32];
  string local_420 [32];
  reference local_400;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  undefined1 local_1a8 [8];
  PassRunner runner;
  ValidationInfo info;
  Flags flags_local;
  Module *module_local;
  WasmValidator *this_local;
  
  info.outputs._M_h._M_single_bucket._4_4_ = flags;
  ValidationInfo::ValidationInfo
            ((ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket,module);
  info.wasm._0_1_ = info.outputs._M_h._M_single_bucket._4_1_ & 1;
  info.wasm._1_1_ = (byte)((info.outputs._M_h._M_single_bucket._4_4_ & 2) >> 1);
  info.wasm._2_1_ = (byte)((info.outputs._M_h._M_single_bucket._4_4_ & 4) >> 2);
  info.wasm._3_1_ = (byte)((info.outputs._M_h._M_single_bucket._4_4_ & 8) >> 3);
  PassRunner::PassRunner((PassRunner *)local_1a8,module);
  FunctionValidator::FunctionValidator
            ((FunctionValidator *)&__range2,module,
             (ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
  FunctionValidator::validate((FunctionValidator *)&__range2,(PassRunner *)local_1a8);
  FunctionValidator::~FunctionValidator((FunctionValidator *)&__range2);
  if ((info.wasm._1_1_ & 1) != 0) {
    validateImports(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateExports(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateGlobals(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateMemories(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateDataSegments(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateTables(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateTags(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateModule(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    validateFeatures(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    if ((info.wasm._3_1_ & 1) != 0) {
      validateClosedWorldInterface
                (module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
    }
  }
  iVar2 = PassRunner::getPassDebug();
  if (iVar2 != 0) {
    validateBinaryenIR(module,(ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
  }
  bVar1 = std::atomic<bool>::load((atomic<bool> *)((long)&info.wasm + 4),memory_order_seq_cst);
  if ((!bVar1) && ((info.wasm._2_1_ & 1) == 0)) {
    __end2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(&module->functions);
    func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(&module->functions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                       *)&func), bVar1) {
      local_400 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                  ::operator*(&__end2);
      func_00 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                          (local_400);
      ValidationInfo::getStream_abi_cxx11_
                ((ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket,func_00);
      std::__cxx11::ostringstream::str();
      std::operator<<((ostream *)&std::cerr,local_420);
      std::__cxx11::string::~string(local_420);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end2);
    }
    ValidationInfo::getStream_abi_cxx11_
              ((ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket,(Function *)0x0);
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)&std::cerr,local_440);
    std::__cxx11::string::~string(local_440);
  }
  bVar1 = std::atomic<bool>::load((atomic<bool> *)((long)&info.wasm + 4),memory_order_seq_cst);
  PassRunner::~PassRunner((PassRunner *)local_1a8);
  ValidationInfo::~ValidationInfo((ValidationInfo *)&runner.skippedPasses._M_h._M_single_bucket);
  return bVar1;
}

Assistant:

bool WasmValidator::validate(Module& module, Flags flags) {
  ValidationInfo info(module);
  info.validateWeb = (flags & Web) != 0;
  info.validateGlobally = (flags & Globally) != 0;
  info.quiet = (flags & Quiet) != 0;
  info.closedWorld = (flags & ClosedWorld) != 0;
  // parallel wasm logic validation
  PassRunner runner(&module);
  FunctionValidator(module, &info).validate(&runner);
  // validate globally
  if (info.validateGlobally) {
    validateImports(module, info);
    validateExports(module, info);
    validateGlobals(module, info);
    validateMemories(module, info);
    validateDataSegments(module, info);
    validateTables(module, info);
    validateTags(module, info);
    validateModule(module, info);
    validateFeatures(module, info);
    if (info.closedWorld) {
      validateClosedWorldInterface(module, info);
    }
  }
  // validate additional internal IR details when in pass-debug mode
  if (PassRunner::getPassDebug()) {
    validateBinaryenIR(module, info);
  }
  // print all the data
  if (!info.valid.load() && !info.quiet) {
    for (auto& func : module.functions) {
      std::cerr << info.getStream(func.get()).str();
    }
    std::cerr << info.getStream(nullptr).str();
  }
  return info.valid.load();
}